

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  WhereLevel *pWVar1;
  byte bVar2;
  u8 uVar3;
  Parse *pParse;
  SrcList *pSVar4;
  sqlite3 *db;
  Vdbe *p;
  WhereLoop *pWVar5;
  Index *pIVar6;
  Table *pTab;
  ushort uVar7;
  ulong uVar8;
  anon_union_16_2_dad992c1_for_u *paVar9;
  VdbeOp *pVVar10;
  Index *pIVar11;
  WhereLevel *pWVar12;
  int iVar13;
  int addr;
  int *piVar14;
  uint uVar15;
  uint uVar16;
  u8 *puVar17;
  ulong local_68;
  
  pParse = pWInfo->pParse;
  pSVar4 = pWInfo->pTabList;
  db = pParse->db;
  p = pParse->pVdbe;
  sqlite3ExprCacheClear(pParse);
  pWVar12 = pWInfo->a;
  uVar8 = (ulong)pWInfo->nLevel;
  while (local_68 = uVar8, 0 < (long)local_68) {
    uVar8 = local_68 - 1;
    pWVar1 = pWVar12 + uVar8;
    pWVar5 = pWInfo->a[local_68 - 1].pWLoop;
    if (pWInfo->a[local_68 - 1].op == 0xa6) {
      piVar14 = p->pParse->aLabel;
      if (piVar14 != (int *)0x0) {
        piVar14[~(long)pWVar1->addrCont] = p->nOp;
      }
    }
    else {
      iVar13 = 0;
      if (((pWInfo->eDistinct == '\x02') && ((pWVar5->wsFlags & 0x200) != 0)) &&
         (pIVar6 = (pWVar5->u).btree.pIndex, (char)pIVar6->field_0x63 < '\0')) {
        uVar7 = (pWVar5->u).btree.nIdxCol;
        iVar13 = 0;
        if ((uVar7 != 0) && (uVar16 = (uint)uVar7, 0x23 < pIVar6->aiRowLogEst[uVar7])) {
          iVar13 = pParse->nMem + 1;
          for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
            sqlite3VdbeAddOp3(p,0x60,pWVar1->iIdxCur,uVar15,uVar15 + iVar13);
          }
          pParse->nMem = pParse->nMem + uVar16 + 1;
          iVar13 = sqlite3VdbeAddOp4Int
                             (p,(uint)(pWVar1->op != '\x06') * 3 + 0x18,pWVar1->iIdxCur,0,iVar13,
                              uVar16);
          sqlite3VdbeAddOp2(p,0xd,1,pWVar1->p2);
        }
      }
      piVar14 = p->pParse->aLabel;
      if (piVar14 != (int *)0x0) {
        piVar14[~(long)pWVar1->addrCont] = p->nOp;
      }
      sqlite3VdbeAddOp3(p,(uint)pWVar1->op,pWVar1->p1,pWVar1->p2,(uint)pWVar1->p3);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (ushort)pWVar1->p5;
      }
      if (iVar13 != 0) {
        sqlite3VdbeJumpHere(p,iVar13);
      }
    }
    if (((pWVar5->wsFlags & 0x800) != 0) && (iVar13 = (pWVar1->u).in.nIn, 0 < iVar13)) {
      piVar14 = p->pParse->aLabel;
      if (piVar14 != (int *)0x0) {
        piVar14[~(long)pWVar1->addrNxt] = p->nOp;
        iVar13 = (pWVar1->u).in.nIn;
      }
      puVar17 = &(pWVar1->u).in.aInLoop[(long)iVar13 + -1].eEndLoopOp;
      for (; 0 < iVar13; iVar13 = iVar13 + -1) {
        sqlite3VdbeJumpHere(p,*(int *)(puVar17 + -4) + 1);
        if (*puVar17 != 0xa6) {
          sqlite3VdbeAddOp2(p,(uint)*puVar17,((InLoop *)(puVar17 + -8))->iCur,*(int *)(puVar17 + -4)
                           );
        }
        sqlite3VdbeJumpHere(p,*(int *)(puVar17 + -4) + -1);
        puVar17 = puVar17 + -0xc;
      }
    }
    piVar14 = p->pParse->aLabel;
    if (piVar14 != (int *)0x0) {
      piVar14[~(long)pWVar1->addrBrk] = p->nOp;
    }
    if (pWVar1->addrSkip != 0) {
      sqlite3VdbeGoto(p,pWVar1->addrSkip);
      sqlite3VdbeJumpHere(p,pWVar1->addrSkip);
      sqlite3VdbeJumpHere(p,pWVar1->addrSkip + -2);
    }
    if (pWVar1->addrLikeRep != 0) {
      sqlite3VdbeAddOp2(p,0x30,pWVar1->iLikeRepCntr >> 1,pWVar1->addrLikeRep);
    }
    if (pWVar1->iLeftJoin != 0) {
      uVar16 = pWVar5->wsFlags;
      iVar13 = sqlite3VdbeAddOp1(p,0x2e,pWVar1->iLeftJoin);
      if ((uVar16 & 0x40) == 0) {
        sqlite3VdbeAddOp1(p,0x7c,pSVar4->a[local_68 - 1].iCursor);
      }
      if (((uVar16 >> 9 & 1) != 0) ||
         (((uVar16 >> 0xd & 1) != 0 && ((pWVar1->u).pCovidx != (Index *)0x0)))) {
        sqlite3VdbeAddOp1(p,0x7c,pWVar1->iIdxCur);
      }
      if (pWVar1->op == '4') {
        sqlite3VdbeAddOp2(p,0xe,pWVar1->p1,pWVar1->addrFirst);
      }
      else {
        sqlite3VdbeGoto(p,pWVar1->addrFirst);
      }
      sqlite3VdbeJumpHere(p,iVar13);
    }
  }
  piVar14 = p->pParse->aLabel;
  if (piVar14 != (int *)0x0) {
    piVar14[~(long)pWInfo->iBreak] = p->nOp;
  }
  uVar16 = 0;
  do {
    if (pWInfo->nLevel <= uVar16) {
      pParse->nQueryLoop = pWInfo->savedNQueryLoop;
      whereInfoFree(db,pWInfo);
      return;
    }
    bVar2 = pWVar12->iFrom;
    if ((pSVar4->a[bVar2].fg.field_0x1 & 0x10) == 0) {
      pTab = pSVar4->a[bVar2].pTab;
      uVar15 = pWVar12->pWLoop->wsFlags;
      if ((uVar15 & 0x240) == 0) {
        if ((uVar15 >> 0xd & 1) == 0) goto LAB_0025e440;
        paVar9 = &pWVar12->u;
      }
      else {
        paVar9 = (anon_union_16_2_dad992c1_for_u *)&(pWVar12->pWLoop->u).btree.pIndex;
      }
      pIVar6 = paVar9->pCovidx;
      if ((pIVar6 != (Index *)0x0) &&
         (((pWInfo->eOnePass == '\0' || ((pIVar6->pTable->tabFlags & 0x20) != 0)) &&
          (db->mallocFailed == '\0')))) {
        iVar13 = p->nOp;
        addr = pWVar12->addrBody;
        pVVar10 = sqlite3VdbeGetOp(p,addr);
        piVar14 = &pVVar10->p2;
        for (; addr < iVar13; addr = addr + 1) {
          if (piVar14[-1] == pWVar12->iTabCur) {
            uVar3 = ((VdbeOp *)(piVar14 + -2))->opcode;
            if (uVar3 == '\x17') {
LAB_0025e4d2:
              piVar14[-1] = pWVar12->iIdxCur;
            }
            else if (uVar3 == '{') {
              piVar14[-1] = pWVar12->iIdxCur;
              ((VdbeOp *)(piVar14 + -2))->opcode = 0x81;
            }
            else if (uVar3 == '`') {
              uVar15 = *piVar14;
              if ((pTab->tabFlags & 0x20) != 0) {
                pIVar11 = sqlite3PrimaryKeyIndex(pTab);
                uVar15 = (uint)(ushort)pIVar11->aiColumn[(int)uVar15];
              }
              uVar7 = sqlite3ColumnOfIndex(pIVar6,(i16)uVar15);
              if (-1 < (short)uVar7) {
                *piVar14 = (uint)uVar7;
                goto LAB_0025e4d2;
              }
            }
          }
          piVar14 = piVar14 + 6;
        }
      }
    }
    else {
      translateColumnToCopy(pParse,pWVar12->addrBody,pWVar12->iTabCur,pSVar4->a[bVar2].regResult,0);
    }
LAB_0025e440:
    uVar16 = uVar16 + 1;
    pWVar12 = pWVar12 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  sqlite3ExprCacheClear(pParse);
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nIdxCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else{
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( pLoop->wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_PrevIfOpen);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_NextIfOpen);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pTabList->a[i].iCursor);
      }
      if( (ws & WHERE_INDEXED) 
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCovidx) 
      ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pTab->zName));
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp;
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx
     && (pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable))
     && !db->mallocFailed
    ){
      last = sqlite3VdbeCurrentAddr(v);
      k = pLevel->addrBody;
      pOp = sqlite3VdbeGetOp(v, k);
      for(; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }
          x = sqlite3ColumnOfIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
          }
          assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 || x>=0 
              || pWInfo->eOnePass );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
        }
      }
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}